

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FramebufferIncompleteLayereTargetsCase::iterate
          (FramebufferIncompleteLayereTargetsCase *this)

{
  int iVar1;
  deUint32 dVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_7f8;
  MessageBuilder local_7e8;
  GetNameFunc local_668;
  int local_660;
  Enum<int,_2UL> local_658;
  MessageBuilder local_648;
  GLenum local_4c4;
  undefined1 local_4c0 [4];
  GLint fboStatus_1;
  Texture texture1_1;
  Texture texture0_1;
  Framebuffer fbo_1;
  string local_470;
  allocator<char> local_449;
  string local_448;
  ScopedLogSection local_428;
  ScopedLogSection section_1;
  Enum<int,_2UL> local_410;
  MessageBuilder local_400;
  GetNameFunc local_280;
  int local_278;
  Enum<int,_2UL> local_270;
  MessageBuilder local_260;
  GLenum local_dc;
  undefined1 local_d8 [4];
  GLint fboStatus;
  Texture texture1;
  Texture texture0;
  Framebuffer fbo;
  string local_88;
  allocator<char> local_61;
  string local_60;
  ScopedLogSection local_40;
  ScopedLogSection section;
  undefined1 local_28 [8];
  CallLogWrapper gl;
  FramebufferIncompleteLayereTargetsCase *this_local;
  
  gl._16_8_ = this;
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_28,(Functions *)CONCAT44(extraout_var,iVar1),pTVar5);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_28,true);
  tcu::TestContext::setTestResult
            ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"LayerAndNonLayer",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Layered and non-layered",
             (allocator<char> *)&fbo.super_ObjectWrapper.field_0x17);
  tcu::ScopedLogSection::ScopedLogSection(&local_40,pTVar5,&local_60,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&fbo.super_ObjectWrapper.field_0x17);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&texture0.super_ObjectWrapper.m_object,pRVar4
            );
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&texture1.super_ObjectWrapper.m_object,pRVar4
            );
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_d8,pRVar4);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture1.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_28,0x8c1a,dVar2);
  glu::CallLogWrapper::glTexImage3D
            ((CallLogWrapper *)local_28,0x8c1a,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)local_28,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)local_28,0x8c1a,0x2801,0x2600);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_d8);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_28,0x8c1a,dVar2);
  glu::CallLogWrapper::glTexImage3D
            ((CallLogWrapper *)local_28,0x8c1a,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)local_28,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)local_28,0x8c1a,0x2801,0x2600);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture0.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindFramebuffer((CallLogWrapper *)local_28,0x8ca9,dVar2);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture1.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glFramebufferTexture((CallLogWrapper *)local_28,0x8ca9,0x8ce0,dVar2,0);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_d8);
  glu::CallLogWrapper::glFramebufferTextureLayer((CallLogWrapper *)local_28,0x8ca9,0x8ce1,dVar2,0,0)
  ;
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_28);
  glu::checkError(GVar3,"setup fbo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1435);
  local_dc = glu::CallLogWrapper::glCheckFramebufferStatus((CallLogWrapper *)local_28,0x8ca9);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_260,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_260,(char (*) [21])"Framebuffer status: ");
  EVar7 = glu::getFramebufferStatusStr(local_dc);
  local_280 = EVar7.m_getName;
  local_278 = EVar7.m_value;
  local_270.m_getName = local_280;
  local_270.m_value = local_278;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_270);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_260);
  if (local_dc != 0x8da8) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_400,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_400,
                        (char (*) [62])
                        "Error, expected GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS, got ");
    EVar7 = glu::getFramebufferStatusStr(local_dc);
    section_1.m_log = (TestLog *)EVar7.m_getName;
    local_410.m_value = EVar7.m_value;
    local_410.m_getName = (GetNameFunc)section_1.m_log;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_410);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_400);
    tcu::TestContext::setTestResult
              ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"invalid layer count");
  }
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_d8);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&texture1.super_ObjectWrapper.m_object);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&texture0.super_ObjectWrapper.m_object);
  tcu::ScopedLogSection::~ScopedLogSection(&local_40);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"DifferentTarget",&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"Different target",
             (allocator<char> *)&fbo_1.super_ObjectWrapper.field_0x17);
  tcu::ScopedLogSection::ScopedLogSection(&local_428,pTVar5,&local_448,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator((allocator<char> *)&fbo_1.super_ObjectWrapper.field_0x17);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&texture0_1.super_ObjectWrapper.m_object,
             pRVar4);
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&texture1_1.super_ObjectWrapper.m_object,
             pRVar4);
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_4c0,pRVar4);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture1_1.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_28,0x8c1a,dVar2);
  glu::CallLogWrapper::glTexImage3D
            ((CallLogWrapper *)local_28,0x8c1a,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)local_28,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)local_28,0x8c1a,0x2801,0x2600);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_4c0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_28,0x806f,dVar2);
  glu::CallLogWrapper::glTexImage3D
            ((CallLogWrapper *)local_28,0x806f,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)local_28,0x806f,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)local_28,0x806f,0x2801,0x2600);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture0_1.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindFramebuffer((CallLogWrapper *)local_28,0x8ca9,dVar2);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture1_1.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glFramebufferTexture((CallLogWrapper *)local_28,0x8ca9,0x8ce0,dVar2,0);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_4c0);
  glu::CallLogWrapper::glFramebufferTexture((CallLogWrapper *)local_28,0x8ca9,0x8ce1,dVar2,0);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_28);
  glu::checkError(GVar3,"setup fbo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1457);
  local_4c4 = glu::CallLogWrapper::glCheckFramebufferStatus((CallLogWrapper *)local_28,0x8ca9);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_648,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_648,(char (*) [21])"Framebuffer status: ");
  EVar7 = glu::getFramebufferStatusStr(local_4c4);
  local_668 = EVar7.m_getName;
  local_660 = EVar7.m_value;
  local_658.m_getName = local_668;
  local_658.m_value = local_660;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_658);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_648);
  if (local_4c4 != 0x8da8) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_7e8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_7e8,
                        (char (*) [62])
                        "Error, expected GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS, got ");
    EVar7 = glu::getFramebufferStatusStr(local_4c4);
    local_7f8.m_getName = EVar7.m_getName;
    local_7f8.m_value = EVar7.m_value;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_7f8);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7e8);
    tcu::TestContext::setTestResult
              ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"invalid layer count");
  }
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_4c0);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&texture1_1.super_ObjectWrapper.m_object);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&texture0_1.super_ObjectWrapper.m_object);
  tcu::ScopedLogSection::~ScopedLogSection(&local_428);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_28);
  return STOP;
}

Assistant:

FramebufferIncompleteLayereTargetsCase::IterateResult FramebufferIncompleteLayereTargetsCase::iterate (void)
{
	glu::CallLogWrapper gl(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	gl.enableLogging(true);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "LayerAndNonLayer", "Layered and non-layered");
		const glu::Framebuffer		fbo				(m_context.getRenderContext());
		const glu::Texture			texture0		(m_context.getRenderContext());
		const glu::Texture			texture1		(m_context.getRenderContext());

		glw::GLint					fboStatus;

		gl.glBindTexture(GL_TEXTURE_2D_ARRAY, *texture0);
		gl.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		gl.glBindTexture(GL_TEXTURE_2D_ARRAY, *texture1);
		gl.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		gl.glBindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);
		gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture0, 0);
		gl.glFramebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, *texture1, 0, 0);

		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup fbo");

		fboStatus = gl.glCheckFramebufferStatus(GL_DRAW_FRAMEBUFFER);
		m_testCtx.getLog() << tcu::TestLog::Message << "Framebuffer status: " << glu::getFramebufferStatusStr(fboStatus) << tcu::TestLog::EndMessage;

		if (fboStatus != GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS, got " << glu::getFramebufferStatusStr(fboStatus) << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid layer count");
		}
	}

	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "DifferentTarget", "Different target");
		const glu::Framebuffer		fbo				(m_context.getRenderContext());
		const glu::Texture			texture0		(m_context.getRenderContext());
		const glu::Texture			texture1		(m_context.getRenderContext());

		glw::GLint					fboStatus;

		gl.glBindTexture(GL_TEXTURE_2D_ARRAY, *texture0);
		gl.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		gl.glBindTexture(GL_TEXTURE_3D, *texture1);
		gl.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		gl.glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		gl.glBindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);
		gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture0, 0);
		gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, *texture1, 0);

		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup fbo");

		fboStatus = gl.glCheckFramebufferStatus(GL_DRAW_FRAMEBUFFER);
		m_testCtx.getLog() << tcu::TestLog::Message << "Framebuffer status: " << glu::getFramebufferStatusStr(fboStatus) << tcu::TestLog::EndMessage;

		if (fboStatus != GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS, got " << glu::getFramebufferStatusStr(fboStatus) << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid layer count");
		}
	}

	return STOP;
}